

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O0

void __thiscall CWire::Print(CWire *this,FILE *pFile,int Mode)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  size_t sVar10;
  CNet *pCVar11;
  ulong uVar12;
  char *pcVar13;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *this_00;
  size_type sVar14;
  reference ppCVar15;
  CDesign *pCVar16;
  undefined8 in_stack_fffffffffffffdf8;
  undefined4 uVar18;
  undefined8 uVar17;
  undefined8 in_stack_fffffffffffffe08;
  undefined4 uVar20;
  undefined8 uVar19;
  char local_181;
  char local_111;
  char local_e9;
  char local_b1;
  char local_91;
  int local_44;
  int j;
  vector<CSegment_*,_std::allocator<CSegment_*>_> *pSegmentList;
  ulong uStack_30;
  int i;
  longlong Key;
  FILE *pFStack_20;
  int Mode_local;
  FILE *pFile_local;
  CWire *this_local;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
  uVar20 = (undefined4)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  if (pFile != (FILE *)0x0) {
    Key._4_4_ = Mode;
    pFStack_20 = (FILE *)pFile;
    pFile_local = (FILE *)this;
    if (Mode == 0) {
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::Y(this->m_pPointS);
      uVar4 = CPoint::Z(this->m_pPointS);
      uVar5 = CPoint::X(this->m_pPointE);
      iVar2 = CPoint::Y(this->m_pPointE);
      iVar6 = CPoint::Z(this->m_pPointE);
      iVar7 = IsRouted(this);
      local_181 = 'o';
      if (iVar7 == 0) {
        local_181 = 'x';
      }
      fprintf((FILE *)pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4,
              (ulong)uVar5,CONCAT44(uVar18,iVar2),iVar6,CONCAT44(uVar20,(int)local_181));
      pCVar11 = GetParent(this);
      pFVar1 = pFStack_20;
      if (pCVar11 != (CNet *)0x0) {
        pCVar11 = GetParent(this);
        uVar12 = CObject::GetKey(&pCVar11->super_CObject);
        fprintf(pFVar1,":net(id:%d) ",uVar12 & 0xffffffff);
      }
      fprintf(pFStack_20,"\n");
    }
    else if (Mode == 1) {
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::X(this->m_pPointS);
      uVar4 = CPoint::Y(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointS);
      iVar2 = IsHorizontal(this);
      local_91 = 's';
      if (iVar2 == 0) {
        local_91 = 'x';
      }
      uVar17 = CONCAT44(uVar18,(int)local_91);
      fprintf((FILE *)pFile,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4
              ,(ulong)uVar5,uVar17);
      pFVar1 = pFStack_20;
      uVar18 = (undefined4)((ulong)uVar17 >> 0x20);
      uVar3 = CPoint::X(this->m_pPointE);
      uVar9 = CPoint::X(this->m_pPointE);
      uVar4 = CPoint::Y(this->m_pPointE);
      uVar5 = CPoint::Y(this->m_pPointE);
      iVar2 = IsHorizontal(this);
      local_b1 = 's';
      if (iVar2 == 0) {
        local_b1 = 'x';
      }
      fprintf(pFVar1,"plot([%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4,
              (ulong)uVar5,CONCAT44(uVar18,(int)local_b1));
      pFVar1 = pFStack_20;
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::X(this->m_pPointE);
      uVar4 = CPoint::Y(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointE);
      iVar2 = IsRouted(this);
      pcVar13 = "-.";
      if (iVar2 != 0) {
        pcVar13 = "-";
      }
      fprintf(pFVar1,"plot([%d,%d],[%d,%d],\'%s\');\n",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4,
              (ulong)uVar5,pcVar13);
    }
    else if (Mode == 0x10) {
      pCVar11 = GetParent(this);
      uVar12 = CObject::GetKey(&pCVar11->super_CObject);
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::Y(this->m_pPointS);
      uVar4 = CPoint::X(this->m_pPointE);
      iVar2 = CPoint::Y(this->m_pPointE);
      fprintf((FILE *)pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",uVar12 & 0xffffffff,
              (ulong)uVar3,(ulong)uVar9,(ulong)uVar4,CONCAT44(uVar18,iVar2));
      fflush(pFStack_20);
      for (pSegmentList._4_4_ = 0; iVar2 = GetNumSegmentList(this), (int)pSegmentList._4_4_ < iVar2;
          pSegmentList._4_4_ = pSegmentList._4_4_ + 1) {
        this_00 = GetSegmentList(this,pSegmentList._4_4_);
        fprintf(pFStack_20,"*segment[%d]\n",(ulong)pSegmentList._4_4_);
        for (local_44 = 0;
            sVar14 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::size(this_00),
            (ulong)(long)local_44 < sVar14; local_44 = local_44 + 1) {
          ppCVar15 = std::vector<CSegment_*,_std::allocator<CSegment_*>_>::operator[]
                               (this_00,(long)local_44);
          (*((*ppCVar15)->super_CObject)._vptr_CObject[2])(*ppCVar15,pFStack_20,0);
        }
      }
    }
    else if (Mode == 0x40) {
      pCVar16 = CObject::GetDesign();
      uVar3 = CParam::GetProp((CParam *)&(pCVar16->super_CBBox).field_0x14);
      pFVar1 = pFStack_20;
      if ((uVar3 & 0x400) == 0) {
        uVar3 = CPoint::X(this->m_pPointS);
        uVar9 = CPoint::Y(this->m_pPointS);
        uVar4 = CPoint::X(this->m_pPointE);
        uVar5 = CPoint::Y(this->m_pPointE);
        fprintf(pFVar1,"(%d,%d,0)-(%d,%d,0)\n",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4,(ulong)uVar5);
      }
      else {
        uVar3 = CPoint::X(this->m_pPointS);
        uVar9 = CPoint::Y(this->m_pPointS);
        uVar4 = CPoint::Z(this->m_pPointS);
        uVar5 = CPoint::X(this->m_pPointE);
        iVar2 = CPoint::Y(this->m_pPointE);
        iVar6 = CPoint::Z(this->m_pPointE);
        fprintf(pFVar1,"(%d,%d,%d)-(%d,%d,%d)\n",(ulong)uVar3,(ulong)uVar9,(ulong)uVar4,(ulong)uVar5
                ,CONCAT44(uVar18,iVar2),iVar6);
      }
    }
    else if (Mode == 0x80) {
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::X(this->m_pPointS);
      uVar4 = CPoint::Y(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointS);
      iVar2 = CPoint::Z(this->m_pPointS);
      iVar6 = CPoint::Z(this->m_pPointS);
      iVar7 = IsHorizontal(this);
      local_e9 = 's';
      if (iVar7 == 0) {
        local_e9 = 'x';
      }
      uVar17 = CONCAT44(uVar18,iVar2);
      uVar19 = CONCAT44(uVar20,(int)local_e9);
      fprintf((FILE *)pFile,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar3,(ulong)uVar9,
              (ulong)uVar4,(ulong)uVar5,uVar17,iVar6,uVar19);
      pFVar1 = pFStack_20;
      uVar20 = (undefined4)((ulong)uVar19 >> 0x20);
      uVar18 = (undefined4)((ulong)uVar17 >> 0x20);
      uVar3 = CPoint::X(this->m_pPointE);
      uVar9 = CPoint::X(this->m_pPointE);
      uVar4 = CPoint::Y(this->m_pPointE);
      uVar5 = CPoint::Y(this->m_pPointE);
      iVar2 = CPoint::Z(this->m_pPointE);
      iVar6 = CPoint::Z(this->m_pPointE);
      iVar7 = IsHorizontal(this);
      local_111 = 's';
      if (iVar7 == 0) {
        local_111 = 'x';
      }
      uVar17 = CONCAT44(uVar18,iVar2);
      fprintf(pFVar1,"plot3([%d,%d],[%d,%d],[%d,%d],\'%c\');\n",(ulong)uVar3,(ulong)uVar9,
              (ulong)uVar4,(ulong)uVar5,uVar17,iVar6,CONCAT44(uVar20,(int)local_111));
      pFVar1 = pFStack_20;
      uVar18 = (undefined4)((ulong)uVar17 >> 0x20);
      uVar3 = CPoint::X(this->m_pPointS);
      uVar9 = CPoint::X(this->m_pPointE);
      uVar4 = CPoint::Y(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointE);
      iVar2 = CPoint::Z(this->m_pPointS);
      iVar6 = CPoint::Z(this->m_pPointE);
      iVar7 = IsRouted(this);
      pcVar13 = "-.";
      if (iVar7 != 0) {
        pcVar13 = "-";
      }
      fprintf(pFVar1,"plot3([%d,%d],[%d,%d],[%d,%d],\'%s\');\n",(ulong)uVar3,(ulong)uVar9,
              (ulong)uVar4,(ulong)uVar5,CONCAT44(uVar18,iVar2),iVar6,pcVar13);
    }
    else if (Mode == 0x100) {
      iVar2 = IsRouted(this);
      uVar3 = 0;
      if (iVar2 != 0) {
        uVar3 = 3;
      }
      iVar2 = IsHorizontal(this);
      uVar9 = 4;
      if (iVar2 != 0) {
        uVar9 = 3;
      }
      uVar4 = CPoint::X(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointS);
      iVar2 = CPoint::X(this->m_pPointE);
      iVar6 = CPoint::Y(this->m_pPointE);
      fprintf((FILE *)pFile,"plot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n",
              (ulong)uVar3,(ulong)uVar9,(ulong)uVar4,(ulong)uVar5,CONCAT44(uVar18,iVar2),iVar6);
    }
    else if (Mode == 0x200) {
      iVar2 = IsRouted(this);
      uVar3 = 0;
      if (iVar2 != 0) {
        uVar3 = 3;
      }
      iVar2 = IsHorizontal(this);
      uVar9 = 4;
      if (iVar2 != 0) {
        uVar9 = 3;
      }
      uVar4 = CPoint::X(this->m_pPointS);
      uVar5 = CPoint::Y(this->m_pPointS);
      iVar2 = CPoint::Z(this->m_pPointS);
      iVar6 = CPoint::X(this->m_pPointE);
      iVar7 = CPoint::Y(this->m_pPointE);
      iVar8 = CPoint::Z(this->m_pPointE);
      fprintf((FILE *)pFile,
              "splot \'-\' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n",
              (ulong)uVar3,(ulong)uVar9,(ulong)uVar4,(ulong)uVar5,CONCAT44(uVar18,iVar2),iVar6,
              CONCAT44(uVar20,iVar7),iVar8);
    }
    else {
      if (Mode != 0x2000) {
        __assert_fail("FALSE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Wire.cpp"
                      ,0x335,"virtual void CWire::Print(FILE *, int)");
      }
      iVar2 = IsCompleted(this);
      if (iVar2 == 0) {
        uStack_30 = CObject::GetKey(&this->m_pPointS->super_CObject);
        uStack_30 = uStack_30 & 0xffffff00;
        sVar10 = fwrite(&stack0xffffffffffffffd0,1,8,pFStack_20);
        if (sVar10 == 0) {
          pCVar11 = GetParent(this);
          uVar12 = CObject::GetKey(&pCVar11->super_CObject);
          CObject::Display(1,"print a wire(S) in net(id:%d)\n",uVar12 & 0xffffffff);
        }
        uStack_30 = CObject::GetKey(&this->m_pPointE->super_CObject);
        uStack_30 = uStack_30 & 0xffffff00;
        sVar10 = fwrite(&stack0xffffffffffffffd0,1,8,pFStack_20);
        if (sVar10 == 0) {
          pCVar11 = GetParent(this);
          uVar12 = CObject::GetKey(&pCVar11->super_CObject);
          CObject::Display(1,"print a wire(E) in net(id:%d)\n",uVar12 & 0xffffffff);
        }
      }
      else {
        uStack_30 = CObject::GetKey(&this->m_pPointS->super_CObject);
        sVar10 = fwrite(&stack0xffffffffffffffd0,1,8,pFStack_20);
        if (sVar10 == 0) {
          pCVar11 = GetParent(this);
          uVar12 = CObject::GetKey(&pCVar11->super_CObject);
          CObject::Display(1,"print a wire(S) in net(id:%d)\n",uVar12 & 0xffffffff);
        }
        uStack_30 = CObject::GetKey(&this->m_pPointE->super_CObject);
        sVar10 = fwrite(&stack0xffffffffffffffd0,1,8,pFStack_20);
        if (sVar10 == 0) {
          pCVar11 = GetParent(this);
          uVar12 = CObject::GetKey(&pCVar11->super_CObject);
          CObject::Display(1,"print a wire(E) in net(id:%d)\n",uVar12 & 0xffffffff);
        }
      }
    }
    fflush(pFStack_20);
  }
  return;
}

Assistant:

void CWire::Print(FILE *pFile, int Mode)
{
	if(pFile==NULL)	return;

	switch(Mode){
	case PRINT_MODE_DUMP:
		{
			KEY	Key;

			if(IsCompleted())
			{
				Key		=	m_pPointS->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey();
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
			else
			{
				Key		=	m_pPointS->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(S) in net(id:%d)\n",(int)GetParent()->GetKey());

				Key		=	m_pPointE->GetKey()&0xFFFFFF00;
				if(!fwrite(&Key,1,sizeof(KEY),pFile))	Display(DISPLAY_MODE_ERRO,"print a wire(E) in net(id:%d)\n",(int)GetParent()->GetKey());
			}
		}
		break;
	case PRINT_MODE_GNUPLOT:
		fprintf(pFile,"plot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d\n %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),
			m_pPointE->X(),m_pPointE->Y());
		break;
	case PRINT_MODE_GNUPLOT3D:
		fprintf(pFile,"splot '-' w linespoints lt %d lw 1 pt %d ps 1\n %d %d %d\n %d %d %d\ne\n",
			IsRouted()? 3:0,
			IsHorizontal()? 3:4,
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		break;
	case PRINT_MODE_MATLAB:
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),m_pPointS->Y(),m_pPointS->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),m_pPointE->Y(),m_pPointE->Y(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot([%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_MATLAB3D:
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointS->X(),m_pPointS->X(),
			m_pPointS->Y(),m_pPointS->Y(),
			m_pPointS->Z(),m_pPointS->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%c');\n",
			m_pPointE->X(),m_pPointE->X(),
			m_pPointE->Y(),m_pPointE->Y(),
			m_pPointE->Z(),m_pPointE->Z(), 
			IsHorizontal()? 's':'x');
		fprintf(pFile,"plot3([%d,%d],[%d,%d],[%d,%d],'%s');\n",
			m_pPointS->X(),m_pPointE->X(),
			m_pPointS->Y(),m_pPointE->Y(),
			m_pPointS->Z(),m_pPointE->Z(),
			IsRouted()? "-":"-.");			
		break;
	case PRINT_MODE_SEGMENT:
		{
			fprintf(pFile,"-------------net(id:%d) - (%d,%d)-(%d,%d)\n",
				(int)GetParent()->GetKey(),
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());fflush(pFile);

			for (int i=0;i<GetNumSegmentList();++i)
			{
				vector<CSegment*>*	pSegmentList	=	GetSegmentList(i);
				fprintf(pFile,"*segment[%d]\n",i);
				for (int j=0;j<pSegmentList->size();++j)
					(*pSegmentList)[j]->Print(pFile,PRINT_MODE_TEXT);
			}
		}
		break;
	case PRINT_MODE_TEXT:	
#ifdef _DEBUG
		fprintf(pFile,"-w[0x%x] (%d,%d,%d)-(%d,%d,%d) %c",(ADDRESS)this,
#else
		fprintf(pFile,"-w (%d,%d,%d)-(%d,%d,%d) %c",
#endif
			m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
			m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z(),
			IsRouted()? 'o':'x');
		if(GetParent())	fprintf(pFile,":net(id:%d) ",(int)GetParent()->GetKey());
		fprintf(pFile,"\n");
		break;
	case PRINT_MODE_RESULT:
		if(GetDesign()->m_Param.GetProp()&PROP_PARAM_MULTILAYER)
		{
			fprintf(pFile,"(%d,%d,%d)-(%d,%d,%d)\n",
				m_pPointS->X(),m_pPointS->Y(),m_pPointS->Z(),
				m_pPointE->X(),m_pPointE->Y(),m_pPointE->Z());
		}
		else
		{
			fprintf(pFile,"(%d,%d,0)-(%d,%d,0)\n",
				m_pPointS->X(),m_pPointS->Y(),
				m_pPointE->X(),m_pPointE->Y());
		}
		break;
	default:
		assert(FALSE);
		break;
	}

	fflush(pFile);
}